

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<unsigned_char,_char,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *t,char *u,uchar *result)

{
  byte bVar1;
  uint32_t uVar2;
  
  bVar1 = *u;
  if (bVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*t != 0) {
    if ('\0' < (char)bVar1) {
      bVar1 = *t / bVar1;
      goto LAB_00105735;
    }
    uVar2 = AbsValueHelper<char,_0>::Abs(bVar1);
    if (uVar2 <= *t) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  bVar1 = 0;
LAB_00105735:
  *result = bVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }